

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_handle_certificate_request
              (ptls_t *tls,ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  ptls_key_schedule_t *ppVar1;
  st_ptls_on_extension_t *psVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint8_t *__dest;
  size_t sVar8;
  long lVar9;
  ushort *puVar10;
  uint8_t *puVar11;
  size_t __size;
  ulong uVar12;
  size_t sVar13;
  ushort *puVar14;
  size_t len;
  ushort uVar15;
  uint uVar16;
  ptls_hash_context_t **pppVar17;
  ptls_iovec_t pVar18;
  ushort *local_60;
  byte local_58 [8];
  ptls_t *local_50;
  ushort *local_48;
  size_t local_40;
  st_ptls_signature_algorithms_t *local_38;
  
  sVar8 = message.len;
  puVar11 = message.base;
  uVar7 = 0x32;
  if (sVar8 == 4) {
    bVar5 = false;
    uVar7 = 0x32;
    local_60 = (ushort *)(puVar11 + 4);
  }
  else {
    puVar14 = (ushort *)(puVar11 + 5);
    uVar12 = (ulong)puVar11[4];
    local_60 = puVar14;
    if (sVar8 - 5 < uVar12) {
      bVar5 = false;
    }
    else {
      local_48 = (ushort *)((long)puVar14 + uVar12);
      __size = 1;
      if (uVar12 != 0) {
        __size = uVar12;
      }
      __dest = (uint8_t *)malloc(__size);
      (tls->field_20).client.certificate_request.context.base = __dest;
      if (__dest != (uint8_t *)0x0) {
        (tls->field_20).client.certificate_request.context.len = uVar12;
        memcpy(__dest,puVar14,uVar12);
        local_60 = local_48;
      }
      uVar7 = 0x32;
      if (local_60 == local_48) {
        uVar7 = 0x201;
      }
      if (__dest == (uint8_t *)0x0) {
        uVar7 = 0x201;
      }
      bVar5 = __dest != (uint8_t *)0x0 && local_60 == local_48;
    }
  }
  if (!bVar5) goto LAB_0012123c;
  puVar14 = (ushort *)(puVar11 + sVar8);
  local_58[0] = 1;
  local_58[1] = 4;
  local_58[2] = 1;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0x3e;
  local_58[6] = 8;
  local_58[7] = 0;
  if ((ulong)((long)puVar14 - (long)local_60) < 2) {
LAB_00121216:
    bVar5 = false;
    uVar7 = 0x32;
  }
  else {
    lVar9 = 0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)*(byte *)((long)local_60 + lVar9) | uVar12 << 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 2);
    local_60 = local_60 + 1;
    if ((ulong)((long)puVar14 - (long)local_60) < uVar12) goto LAB_00121216;
    if (uVar12 == 0) {
      bVar5 = true;
    }
    else {
      local_48 = puVar14;
      puVar14 = (ushort *)(uVar12 + (long)local_60);
      local_38 = &(tls->field_20).client.certificate_request.signature_algorithms;
      uVar16 = 0;
      local_40 = sVar8;
      local_50 = tls;
      do {
        lVar9 = (long)puVar14 - (long)local_60;
        uVar7 = 0x32;
        if (1 < lVar9) {
          uVar16 = (uint)(ushort)(*local_60 << 8 | *local_60 >> 8);
          local_60 = local_60 + 1;
          uVar7 = 0;
        }
        bVar5 = true;
        if (lVar9 < 2) goto LAB_00121420;
        uVar15 = (ushort)uVar16;
        if (uVar15 < 0x40) {
          if ((local_58[uVar16 >> 3] >> (uVar16 & 7) & 1) != 0) {
            uVar7 = 0x2f;
            goto LAB_00121420;
          }
          local_58[uVar16 >> 3] = local_58[uVar16 >> 3] | (byte)(1 << ((byte)uVar16 & 7));
        }
        uVar7 = 0x32;
        if ((ulong)((long)puVar14 - (long)local_60) < 2) {
          bVar3 = false;
        }
        else {
          lVar9 = 0;
          uVar12 = 0;
          do {
            uVar12 = (ulong)*(byte *)((long)local_60 + lVar9) | uVar12 << 8;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 2);
          puVar10 = local_60 + 1;
          bVar3 = false;
          sVar8 = local_40;
          local_60 = puVar10;
          if (uVar12 <= (ulong)((long)puVar14 - (long)puVar10)) {
            psVar2 = tls->ctx->on_extension;
            uVar7 = 0;
            if (psVar2 == (st_ptls_on_extension_t *)0x0) {
LAB_001213be:
              sVar8 = local_40;
              uVar4 = uVar7;
              if (uVar15 == 0xd) {
                uVar7 = decode_signature_algorithms
                                  (local_38,(uint8_t **)&local_60,
                                   (uint8_t *)((long)puVar10 + uVar12));
                tls = local_50;
                uVar4 = 0;
                if (uVar7 != 0) goto LAB_001213e5;
              }
              uVar7 = uVar4;
              bVar5 = false;
              bVar3 = true;
              local_60 = (ushort *)((long)puVar10 + uVar12);
            }
            else {
              pVar18.len = uVar12;
              pVar18.base = (uint8_t *)puVar10;
              iVar6 = (*psVar2->cb)(psVar2,tls,'\r',uVar15,pVar18);
              uVar7 = (uint)(iVar6 != 0);
              tls = local_50;
              sVar8 = local_40;
              if (iVar6 == 0) goto LAB_001213be;
LAB_001213e5:
              bVar3 = false;
              tls = local_50;
            }
          }
        }
        if (!bVar3) goto LAB_00121420;
      } while (local_60 != puVar14);
      bVar5 = false;
LAB_00121420:
      bVar5 = !bVar5;
      puVar14 = local_48;
    }
  }
  if (((bVar5) && (uVar7 = 0x32, local_60 == puVar14)) &&
     (uVar7 = 0x6d, (tls->field_20).client.certificate_request.signature_algorithms.count != 0)) {
    uVar7 = 0;
  }
LAB_0012123c:
  if ((uVar7 == 0) && (uVar7 = 0x2f, (tls->field_20).client.certificate_request.context.len == 0)) {
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
    ppVar1 = tls->key_schedule;
    uVar7 = 0x202;
    if (ppVar1->num_hashes != 0) {
      pppVar17 = &ppVar1->hashes[0].ctx;
      sVar13 = 0;
      do {
        (*(*pppVar17)->update)(*pppVar17,puVar11,sVar8);
        sVar13 = sVar13 + 1;
        pppVar17 = pppVar17 + 2;
      } while (sVar13 != ppVar1->num_hashes);
    }
  }
  return uVar7;
}

Assistant:

static int client_handle_certificate_request(ptls_t *tls, ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    int ret = 0;

    if ((ret = decode_certificate_request(tls, &tls->client.certificate_request, src, end)) != 0)
        return ret;

    /* This field SHALL be zero length unless used for the post-handshake authentication exchanges (section 4.3.2) */
    if (tls->client.certificate_request.context.len != 0)
        return PTLS_ALERT_ILLEGAL_PARAMETER;

    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    return PTLS_ERROR_IN_PROGRESS;
}